

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O2

bool __thiscall
base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Add
          (HookList<void_(*)(const_void_*,_unsigned_long)> *this,
          _func_void_void_ptr_unsigned_long *value)

{
  ulong uVar1;
  __int_type_conflict _Var2;
  bool bVar3;
  SpinLockHolder local_28;
  SpinLockHolder l;
  
  if (value == (_func_void_void_ptr_unsigned_long *)0x0) {
    bVar3 = false;
  }
  else {
    local_28.lock_ = (SpinLock *)&hooklist_spinlock;
    SpinLock::Lock((SpinLock *)&hooklist_spinlock);
    for (_Var2 = 1; bVar3 = _Var2 != 8, bVar3; _Var2 = _Var2 + 1) {
      if (this->priv_data[_Var2 - 1] == (_func_void_void_ptr_unsigned_long *)0x0) {
        uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
        this->priv_data[_Var2 - 1] = value;
        if (uVar1 <= _Var2 - 1) {
          (this->priv_end).super___atomic_base<unsigned_long>._M_i = _Var2;
        }
        break;
      }
    }
    SpinLockHolder::~SpinLockHolder(&local_28);
  }
  return bVar3;
}

Assistant:

bool HookList<T>::Add(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  // Find the first slot in data that is 0.
  int index = 0;
  while ((index < kHookListMaxValues) &&
         cast_priv_data(index)->load(std::memory_order_relaxed) != T{}) {
    ++index;
  }
  if (index == kHookListMaxValues) {
    return false;
  }
  uintptr_t prev_num_hooks = priv_end.load(std::memory_order_acquire);
  cast_priv_data(index)->store(value, std::memory_order_relaxed);
  if (prev_num_hooks <= index) {
    priv_end.store(index + 1, std::memory_order_relaxed);
  }
  return true;
}